

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

void __thiscall WebSocketsession::run(WebSocketsession *this)

{
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  bind_front_wrapper<void_(WebSocketsession::*)(),_std::shared_ptr<WebSocketsession>_> local_58;
  any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
  local_38;
  
  boost::asio::execution::
  any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
  ::any_executor(&local_38,
                 &(((((this->ws).impl_.px)->
                    super_empty_value<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_0U,_false>
                    ).value_.impl_.px)->socket).
                  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  .impl_.executor_);
  std::__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<WebSocketsession,void>
            ((__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (__weak_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_58.h_ = (offset_in_WebSocketsession_to_subr)on_run;
  local_58._8_8_ = 0;
  local_58.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
  super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
  local_58.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
  super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_60;
  local_68 = (element_type *)0x0;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::asio::
  dispatch<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::detail::bind_front_wrapper<void_(WebSocketsession::*)(),_std::shared_ptr<WebSocketsession>_>_>
            (&local_38,&local_58,(type *)0x0);
  if (local_58.args_.
      super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
      .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
      super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.args_.
               super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
               .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
               super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  (*(local_38.super_any_executor_base.object_fns_)->destroy)(&local_38.super_any_executor_base);
  return;
}

Assistant:

void run()
    {
        // We need to be executing within a strand to perform async operations
        // on the I/O objects in this session. Although not strictly necessary
        // for single-threaded contexts, this example code is written to be
        // thread-safe by default.
        net::dispatch(ws.get_executor(),
                      beast::bind_front_handler(&WebSocketsession::on_run, shared_from_this()));
    }